

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O1

void tlb_init_m68k(CPUState *cpu)

{
  void *pvVar1;
  gpointer pvVar2;
  undefined8 *puVar3;
  long lVar4;
  timeval tv;
  timeval local_30;
  
  pvVar1 = cpu->env_ptr;
  lVar4 = 0;
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  *(undefined2 *)((long)pvVar1 + -0x5b0) = 0;
  puVar3 = (undefined8 *)((long)pvVar1 + -0x590);
  do {
    puVar3[1] = local_30.tv_usec * 1000 + local_30.tv_sec * 1000000000;
    puVar3[2] = 0;
    puVar3[3] = 0;
    *(undefined8 *)((long)pvVar1 + lVar4 + -0x30) = 0x3fc0;
    pvVar2 = g_malloc(0x4000);
    *(gpointer *)((long)pvVar1 + lVar4 + -0x28) = pvVar2;
    pvVar2 = g_malloc(0x1000);
    puVar3[0x55] = pvVar2;
    puVar3[3] = 0;
    puVar3[4] = 0;
    *puVar3 = 0xffffffffffffffff;
    memset(*(void **)((long)pvVar1 + lVar4 + -0x28),0xff,
           *(long *)((long)pvVar1 + lVar4 + -0x30) + 0x40);
    memset(puVar3 + 5,0xff,0x200);
    lVar4 = lVar4 + 0x10;
    puVar3 = puVar3 + 0x56;
  } while (lVar4 == 0x10);
  return;
}

Assistant:

void tlb_init(CPUState *cpu)
{
    CPUArchState *env = cpu->env_ptr;
    int64_t now = get_clock_realtime();
    int i;

    /* All tlbs are initialized flushed. */
    env_tlb(env)->c.dirty = 0;

    for (i = 0; i < NB_MMU_MODES; i++) {
        tlb_mmu_init(&env_tlb(env)->d[i], &env_tlb(env)->f[i], now);
    }
}